

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

bool __thiscall tcmalloc::PageHeap::CheckExpensive(PageHeap *this)

{
  Span *list;
  Length min_pages;
  
  CheckSet(this,&this->large_normal_,0x81,1);
  CheckSet(this,&this->large_returned_,0x81,2);
  list = &this->free_[0].returned;
  for (min_pages = 1; min_pages != 0x81; min_pages = min_pages + 1) {
    CheckList(this,list + -1,min_pages,min_pages,1);
    CheckList(this,list,min_pages,min_pages,2);
    list = list + 2;
  }
  return true;
}

Assistant:

bool PageHeap::CheckExpensive() {
  bool result = Check();
  CheckSet(&large_normal_, kMaxPages + 1, Span::ON_NORMAL_FREELIST);
  CheckSet(&large_returned_, kMaxPages + 1, Span::ON_RETURNED_FREELIST);
  for (int s = 1; s <= kMaxPages; s++) {
    CheckList(&free_[s - 1].normal, s, s, Span::ON_NORMAL_FREELIST);
    CheckList(&free_[s - 1].returned, s, s, Span::ON_RETURNED_FREELIST);
  }
  return result;
}